

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_constructor
                  (JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int classid)

{
  uint uVar1;
  int64_t iVar2;
  uint *puVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  JSValueUnion JVar8;
  ulong uVar9;
  uint32_t uVar10;
  int64_t iVar11;
  JSRefCountHeader *p;
  char *fmt;
  uint64_t offset;
  JSRefCountHeader *p_1;
  JSValueUnion JVar12;
  int *piVar13;
  JSValue obj;
  JSValue obj_00;
  JSValue v;
  JSValue v_00;
  JSValue obj_01;
  JSValue enum_obj;
  JSValue v_01;
  JSValue v_02;
  JSValue obj_02;
  JSValue v_03;
  JSValue this_obj;
  JSValue v_04;
  JSValue obj_03;
  JSValue this_obj_00;
  JSValue v_05;
  JSValue v_06;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue method;
  JSValue JVar17;
  JSValue buffer;
  JSValue method_00;
  JSValue buffer_00;
  JSValue buffer_01;
  JSValue obj_04;
  JSValue val;
  JSValue this_obj_01;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar18;
  undefined4 in_stack_ffffffffffffff6c;
  BOOL *in_stack_ffffffffffffff70;
  uint64_t local_88;
  ulong local_80;
  undefined8 local_70;
  long local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  ulong local_50;
  JSValueUnion local_48;
  int64_t local_40;
  ulong local_38;
  
  local_50 = (ulong)(byte)"includes"[(long)classid + 1];
  iVar2 = argv->tag;
  if ((int)iVar2 != -1) {
    JVar14.tag = iVar2;
    JVar14.u.ptr = (argv->u).ptr;
    iVar6 = JS_ToIndex(ctx,&local_70,JVar14);
    if (iVar6 != 0) {
      JVar15 = (JSValue)(ZEXT816(6) << 0x40);
      uVar9 = 0;
      goto LAB_0012cc4b;
    }
    local_88 = CONCAT44(local_70._4_4_,(int)local_70);
    JVar14 = js_array_buffer_constructor1
                       (ctx,(JSValue)(ZEXT816(3) << 0x40),local_88 << ((byte)local_50 & 0x3f));
    if ((int)JVar14.tag == 6) {
      uVar9 = 0;
      JVar15 = (JSValue)(ZEXT816(6) << 0x40);
      goto LAB_0012cc4b;
    }
    local_80 = 0;
LAB_0012c7c4:
    JVar15 = js_create_from_ctor(ctx,new_target,classid);
    if (((int)JVar15.tag != 6) &&
       (obj.tag = (int64_t)JVar14.u.ptr, obj.u.ptr = JVar15.u.ptr, buffer.tag = local_80,
       buffer.u = (JSValueUnion)(JSValueUnion)JVar14.tag,
       iVar6 = typed_array_init(ctx,obj,buffer,local_88,
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
       JVar14 = JVar15, iVar6 == 0)) {
      uVar9 = (ulong)JVar15.u.ptr & 0xffffffff00000000;
      goto LAB_0012cc4b;
    }
    JS_FreeValue(ctx,JVar14);
    goto LAB_0012c85f;
  }
  JVar12 = (JSValueUnion)(argv->u).ptr;
  if (1 < (ushort)(*(short *)((long)JVar12.ptr + 6) - 0x13U)) {
    if ((ushort)(*(short *)((long)JVar12.ptr + 6) - 0x15U) < 9) {
      JVar14 = js_create_from_ctor(ctx,new_target,classid);
      if ((int)JVar14.tag == 6) {
LAB_0012c6d9:
        uVar9 = (ulong)JVar14.u.ptr & 0xffffffff00000000;
      }
      else {
        lVar4 = *(long *)((long)JVar12.ptr + 0x30);
        JVar8 = (JSValueUnion)
                ((JSValueUnion *)((long)((JSValueUnion *)(lVar4 + 0x18))->ptr + 0x30))->ptr;
        if (*(char *)((long)JVar8.ptr + 4) == '\0') {
          local_58._4_4_ = 0;
          local_58.int32 = *(uint *)((long)JVar12.ptr + 0x40);
          local_68 = lVar4;
          local_60 = JVar8;
          if (*(char *)((long)JVar8.ptr + 5) == '\0') {
            obj_00.tag = -1;
            obj_00.u.ptr = ((JSValueUnion *)(lVar4 + 0x18))->ptr;
            JVar15 = JS_SpeciesConstructor(ctx,obj_00,(JSValue)(ZEXT816(3) << 0x40));
            if ((int)JVar15.tag != 6) goto LAB_0012c96c;
          }
          else {
            JVar15 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0012c96c:
            local_48 = JVar15.u;
            JVar16 = js_array_buffer_constructor1
                               (ctx,JVar15,(long)local_58.ptr << ((byte)local_50 & 0x3f));
            local_50 = JVar16.tag;
            JVar8 = JVar16.u;
            v.tag = JVar15.tag;
            v.u.float64 = local_48.float64;
            JS_FreeValue(ctx,v);
            if ((local_50 & 0xffffffff) != 6) {
              if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar12.ptr + 0x30) + 0x18) + 0x30) +
                           4) != '\0') {
                v_00.tag = local_50;
                v_00.u.ptr = JVar8.ptr;
                JS_FreeValue(ctx,v_00);
                goto LAB_0012c7fd;
              }
              if ((int)local_50 == -1) {
                if (*(short *)((long)JVar8.ptr + 6) == 0x13) {
                  piVar13 = *(int **)((long)JVar8.ptr + 0x30);
                }
                else {
                  piVar13 = (int *)0x0;
                }
              }
              else {
                piVar13 = (int *)0x0;
              }
              obj_03.tag = (int64_t)JVar8.ptr;
              obj_03.u.float64 = JVar14.u.float64;
              buffer_01.tag = 0;
              buffer_01.u = (JSValueUnion)local_50;
              iVar6 = typed_array_init(ctx,obj_03,buffer_01,(uint64_t)local_58,
                                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                                      );
              if (iVar6 == 0) {
                if ((uint)*(ushort *)((long)JVar12.ptr + 6) == classid) {
                  memcpy(*(void **)(piVar13 + 2),
                         (void *)((ulong)*(uint *)(local_68 + 0x20) +
                                 *(long *)((long)local_60.ptr + 8)),(long)*piVar13);
                  goto LAB_0012c6d9;
                }
                uVar10 = 0;
                do {
                  if (local_58._0_4_ == uVar10) goto LAB_0012c6d9;
                  this_obj_00.tag = iVar2;
                  this_obj_00.u.ptr = JVar12.ptr;
                  JVar15 = JS_GetPropertyUint32(ctx,this_obj_00,uVar10);
                  if ((int)JVar15.tag == 6) break;
                  iVar6 = JS_SetPropertyUint32(ctx,JVar14,uVar10,JVar15);
                  uVar10 = uVar10 + 1;
                } while (-1 < iVar6);
              }
            }
          }
        }
        else {
LAB_0012c7fd:
          JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        }
        JS_FreeValue(ctx,JVar14);
        JVar14 = (JSValue)(ZEXT816(6) << 0x40);
        uVar9 = 0;
      }
    }
    else {
      JVar14 = js_create_from_ctor(ctx,new_target,classid);
      if ((int)JVar14.tag != 6) {
        uVar18 = 0;
        JVar16.tag = iVar2;
        JVar16.u.ptr = JVar12.ptr;
        this_obj_01.tag = iVar2;
        this_obj_01.u.ptr = JVar12.ptr;
        JVar15 = JS_GetPropertyInternal(ctx,JVar16,0xc6,this_obj_01,0);
        iVar11 = 3;
        if ((int)JVar15.tag - 2U < 2) {
          obj_04.tag = iVar2;
          obj_04.u.ptr = JVar12.ptr;
          iVar6 = js_get_length64(ctx,&local_70,obj_04);
          if (iVar6 == 0) {
            *(int *)JVar12.ptr = *JVar12.ptr + 1;
            offset = CONCAT44(local_70._4_4_,(int)local_70);
            iVar11 = iVar2;
LAB_0012cbcb:
            JVar15 = js_array_buffer_constructor1
                               (ctx,(JSValue)(ZEXT816(3) << 0x40),offset << ((byte)local_50 & 0x3f))
            ;
            if ((int)JVar15.tag != 6) {
              uVar9 = 0;
              obj_02.tag = (int64_t)JVar15.u.ptr;
              obj_02.u.float64 = JVar14.u.float64;
              buffer_00.tag = 0;
              buffer_00.u = (JSValueUnion)JVar15.tag;
              iVar6 = typed_array_init(ctx,obj_02,buffer_00,offset,
                                       CONCAT44(in_stack_ffffffffffffff6c,uVar18));
              if (iVar6 == 0) {
                do {
                  uVar10 = (uint32_t)uVar9;
                  if ((long)offset <= (long)uVar9) {
                    v_04.tag = iVar11;
                    v_04.u.ptr = JVar12.ptr;
                    JS_FreeValue(ctx,v_04);
                    goto LAB_0012c6d9;
                  }
                  this_obj.tag = iVar11;
                  this_obj.u.ptr = JVar12.ptr;
                  JVar15 = JS_GetPropertyUint32(ctx,this_obj,uVar10);
                  if ((int)JVar15.tag == 6) break;
                  iVar6 = JS_SetPropertyUint32(ctx,JVar14,uVar10,JVar15);
                  uVar9 = (ulong)(uVar10 + 1);
                } while (-1 < iVar6);
              }
            }
          }
          else {
            JVar12.float64 = 0.0;
          }
        }
        else if ((int)JVar15.tag == 6) {
          JVar12.float64 = 0.0;
        }
        else {
          local_58 = JVar15.u;
          local_48 = (JSValueUnion)JVar15.tag;
          JVar15 = JS_NewArray(ctx);
          if ((int)JVar15.tag == 6) {
            uVar9 = (ulong)JVar15.u.ptr & 0xffffffff00000000;
            offset = 0;
          }
          else {
            obj_01.tag = iVar2;
            obj_01.u.ptr = JVar12.ptr;
            method_00.tag = (int64_t)local_48.ptr;
            method_00.u.ptr = local_58.ptr;
            JVar16 = JS_GetIterator2(ctx,obj_01,method_00);
            enum_obj.tag = JVar16.tag;
            JVar12 = JVar16.u;
            if ((int)JVar16.tag == 6) {
              method = (JSValue)(ZEXT816(3) << 0x40);
            }
            else {
              uVar18 = 0;
              method = JS_GetPropertyInternal(ctx,JVar16,0x6a,JVar16,0);
              if ((int)method.tag != 6) {
                uVar7 = 0;
                local_68 = method.tag;
                local_60 = JVar12;
                while( true ) {
                  JVar12 = method.u;
                  enum_obj.u.ptr = local_60.ptr;
                  JVar16 = JS_IteratorNext(ctx,enum_obj,method,(int)&local_70,
                                           (JSValue *)CONCAT44(in_stack_ffffffffffffff6c,uVar18),
                                           in_stack_ffffffffffffff70);
                  if ((int)JVar16.tag == 6) break;
                  offset = (uint64_t)uVar7;
                  if ((int)local_70 != 0) {
                    local_40 = enum_obj.tag;
                    JS_FreeValue(ctx,JVar16);
                    v_05.tag = local_68;
                    v_05.u.ptr = JVar12.ptr;
                    JS_FreeValue(ctx,v_05);
                    v_06.tag = local_40;
                    v_06.u.ptr = local_60.ptr;
                    JS_FreeValue(ctx,v_06);
                    uVar9 = (ulong)JVar15.u.ptr & 0xffffffff00000000;
                    goto LAB_0012cba8;
                  }
                  uVar18 = 0x4000;
                  iVar6 = JS_CreateDataPropertyUint32(ctx,JVar15,offset,JVar16,0x4000);
                  if (iVar6 < 0) break;
                  uVar7 = uVar7 + 1;
                  method.tag = local_68;
                  method.u.ptr = JVar12.ptr;
                }
                method.tag = local_68;
                method.u.ptr = JVar12.ptr;
                JVar12 = local_60;
              }
            }
            JS_FreeValue(ctx,method);
            v_01.tag = enum_obj.tag;
            v_01.u.ptr = JVar12.ptr;
            JS_FreeValue(ctx,v_01);
            JS_FreeValue(ctx,JVar15);
            offset = 0;
            JVar15 = (JSValue)(ZEXT816(6) << 0x40);
            uVar9 = 0;
          }
LAB_0012cba8:
          iVar11 = JVar15.tag;
          JVar12.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar9);
          v_02.tag = (int64_t)local_48.ptr;
          v_02.u.ptr = local_58.ptr;
          JS_FreeValue(ctx,v_02);
          if ((int)JVar15.tag != 6) goto LAB_0012cbcb;
        }
        v_03.tag = iVar11;
        v_03.u.float64 = JVar12.float64;
        JS_FreeValue(ctx,v_03);
        JS_FreeValue(ctx,JVar14);
      }
      uVar9 = 0;
      JVar14 = (JSValue)(ZEXT816(6) << 0x40);
    }
    JVar15.tag = JVar14.tag;
    JVar15.u.float64 = JVar14.u.float64 | uVar9;
    goto LAB_0012cc4b;
  }
  puVar3 = *(uint **)((long)JVar12.ptr + 0x30);
  iVar6 = JS_ToIndex(ctx,&local_38,argv[1]);
  if (iVar6 == 0) {
    if ((char)puVar3[1] == '\0') {
      bVar5 = (byte)local_50;
      uVar7 = ~(-1 << (bVar5 & 0x1f));
      if (((uint)local_38 & uVar7) == 0) {
        uVar1 = *puVar3;
        if ((ulong)(long)(int)uVar1 < local_38) goto LAB_0012c896;
        local_80 = local_38;
        if ((int)argv[2].tag == 3) {
          if ((uVar1 & uVar7) == 0) {
            local_88 = (long)(int)uVar1 - local_38 >> (bVar5 & 0x3f);
LAB_0012ccc0:
            JVar14 = *argv;
            JVar15 = *argv;
            if (0xfffffff4 < (uint)argv->tag) {
              *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
              JVar14 = JVar15;
            }
            goto LAB_0012c7c4;
          }
        }
        else {
          val.tag = argv[2].tag;
          val.u.ptr = argv[2].u.ptr;
          iVar6 = JS_ToIndex(ctx,&local_70,val);
          if (iVar6 != 0) goto LAB_0012c85f;
          if ((char)puVar3[1] != '\0') goto LAB_0012c67d;
          local_88 = CONCAT44(local_70._4_4_,(int)local_70);
          if ((local_88 << (bVar5 & 0x3f)) + local_38 <= (ulong)(long)(int)*puVar3)
          goto LAB_0012ccc0;
        }
        fmt = "invalid length";
      }
      else {
LAB_0012c896:
        fmt = "invalid offset";
      }
      JS_ThrowRangeError(ctx,fmt);
    }
    else {
LAB_0012c67d:
      JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    }
  }
LAB_0012c85f:
  uVar9 = 0;
  JVar15 = (JSValue)(ZEXT816(6) << 0x40);
LAB_0012cc4b:
  JVar17.u.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar9);
  JVar17.tag = JVar15.tag;
  return JVar17;
}

Assistant:

static JSValue js_typed_array_constructor(JSContext *ctx,
                                          JSValueConst new_target,
                                          int argc, JSValueConst *argv,
                                          int classid)
{
    JSValue buffer, obj;
    JSArrayBuffer *abuf;
    int size_log2;
    uint64_t len, offset;

    size_log2 = typed_array_size_log2(classid);
    if (JS_VALUE_GET_TAG(argv[0]) != JS_TAG_OBJECT) {
        if (JS_ToIndex(ctx, &len, argv[0]))
            return JS_EXCEPTION;
        buffer = js_array_buffer_constructor1(ctx, JS_UNDEFINED,
                                              len << size_log2);
        if (JS_IsException(buffer))
            return JS_EXCEPTION;
        offset = 0;
    } else {
        JSObject *p = JS_VALUE_GET_OBJ(argv[0]);
        if (p->class_id == JS_CLASS_ARRAY_BUFFER ||
            p->class_id == JS_CLASS_SHARED_ARRAY_BUFFER) {
            abuf = p->u.array_buffer;
            if (JS_ToIndex(ctx, &offset, argv[1]))
                return JS_EXCEPTION;
            if (abuf->detached)
                return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
            if ((offset & ((1 << size_log2) - 1)) != 0 ||
                offset > abuf->byte_length)
                return JS_ThrowRangeError(ctx, "invalid offset");
            if (JS_IsUndefined(argv[2])) {
                if ((abuf->byte_length & ((1 << size_log2) - 1)) != 0)
                    goto invalid_length;
                len = (abuf->byte_length - offset) >> size_log2;
            } else {
                if (JS_ToIndex(ctx, &len, argv[2]))
                    return JS_EXCEPTION;
                if (abuf->detached)
                    return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
                if ((offset + (len << size_log2)) > abuf->byte_length) {
                invalid_length:
                    return JS_ThrowRangeError(ctx, "invalid length");
                }
            }
            buffer = JS_DupValue(ctx, argv[0]);
        } else {
            if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                return js_typed_array_constructor_ta(ctx, new_target, argv[0], classid);
            } else {
                return js_typed_array_constructor_obj(ctx, new_target, argv[0], classid);
            }
        }
    }

    obj = js_create_from_ctor(ctx, new_target, classid);
    if (JS_IsException(obj)) {
        JS_FreeValue(ctx, buffer);
        return JS_EXCEPTION;
    }
    if (typed_array_init(ctx, obj, buffer, offset, len)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    return obj;
}